

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScalar.h
# Opt level: O0

char * btAlignPointer<char>(char *unalignedPtr,size_t alignment)

{
  size_t bit_mask;
  btConvertPointerSizeT converter;
  size_t alignment_local;
  char *unalignedPtr_local;
  
  return (char *)((alignment - 1 ^ 0xffffffffffffffff) & (ulong)(unalignedPtr + (alignment - 1)));
}

Assistant:

T* btAlignPointer(T* unalignedPtr, size_t alignment)
{
		
	struct btConvertPointerSizeT
	{
		union 
		{
				T* ptr;
				size_t integer;
		};
	};
    btConvertPointerSizeT converter;
    
    
	const size_t bit_mask = ~(alignment - 1);
    converter.ptr = unalignedPtr;
	converter.integer += alignment-1;
	converter.integer &= bit_mask;
	return converter.ptr;
}